

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O3

void __thiscall Pl_Flate::~Pl_Flate(Pl_Flate *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Flate_002f04b0;
  std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::~unique_ptr(&this->m)
  ;
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002f0038;
  pcVar1 = (this->super_Pipeline).identifier._M_dataplus._M_p;
  paVar2 = &(this->super_Pipeline).identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Pl_Flate::~Pl_Flate() = default;